

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void __thiscall duckdb::MD5Context::MD5Update(MD5Context *this,const_data_ptr_t input,idx_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  idx_t __n;
  ulong __n_00;
  
  uVar8 = this->bits[0];
  uVar10 = (int)len * 8;
  this->bits[0] = uVar10 + uVar8;
  if (CARRY4(uVar10,uVar8)) {
    this->bits[1] = this->bits[1] + 1;
  }
  this->bits[1] = this->bits[1] + (int)(len >> 0x1d);
  uVar8 = uVar8 >> 3 & 0x3f;
  __n = len;
  if (uVar8 != 0) {
    __n_00 = (ulong)(0x40 - uVar8);
    __n = len - __n_00;
    if (len < __n_00) {
      switchD_012dd528::default(this->in + uVar8,input,len);
      __n = len;
    }
    else {
      switchD_012dd528::default(this->in + uVar8,input,__n_00);
      iVar9 = 6;
      do {
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0x16);
      MD5Transform(this->buf,(uint32_t *)this->in);
      input = input + __n_00;
    }
    if (len < __n_00) {
      return;
    }
  }
  if (0x3f < __n) {
    do {
      uVar1 = *(undefined8 *)input;
      uVar2 = *(undefined8 *)(input + 8);
      uVar3 = *(undefined8 *)(input + 0x10);
      uVar4 = *(undefined8 *)(input + 0x18);
      uVar5 = *(undefined8 *)(input + 0x20);
      uVar6 = *(undefined8 *)(input + 0x28);
      uVar7 = *(undefined8 *)(input + 0x38);
      *(undefined8 *)(this->in + 0x30) = *(undefined8 *)(input + 0x30);
      *(undefined8 *)(this->in + 0x38) = uVar7;
      *(undefined8 *)(this->in + 0x20) = uVar5;
      *(undefined8 *)(this->in + 0x28) = uVar6;
      *(undefined8 *)(this->in + 0x10) = uVar3;
      *(undefined8 *)(this->in + 0x18) = uVar4;
      *(undefined8 *)this->in = uVar1;
      *(undefined8 *)(this->in + 8) = uVar2;
      iVar9 = 6;
      do {
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0x16);
      MD5Transform(this->buf,(uint32_t *)this->in);
      input = input + 0x40;
      __n = __n - 0x40;
    } while (0x3f < __n);
  }
  switchD_012dd528::default(this->in,input,__n);
  return;
}

Assistant:

void MD5Context::MD5Update(const_data_ptr_t input, idx_t len) {
	uint32_t t;

	/* Update bitcount */

	t = bits[0];
	bits[0] = t + ((uint32_t)len << 3);
	if (bits[0] < t) {
		bits[1]++; /* Carry from low to high */
	}
	bits[1] += len >> 29;

	t = (t >> 3) & 0x3f; /* Bytes already in shsInfo->data */

	/* Handle any leading odd-sized chunks */

	if (t) {
		unsigned char *p = (unsigned char *)in + t;

		t = 64 - t;
		if (len < t) {
			memcpy(p, input, len);
			return;
		}
		memcpy(p, input, t);
		ByteReverse(in, 16);
		MD5Transform(buf, reinterpret_cast<uint32_t *>(in));
		input += t;
		len -= t;
	}

	/* Process data in 64-byte chunks */

	while (len >= 64) {
		memcpy(in, input, 64);
		ByteReverse(in, 16);
		MD5Transform(buf, reinterpret_cast<uint32_t *>(in));
		input += 64;
		len -= 64;
	}

	/* Handle any remaining bytes of data. */
	memcpy(in, input, len);
}